

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  initializer_list<int> __l;
  Data data;
  raw serializer;
  Sample_t<kiste::terminal_t,_Data,_kiste::raw> sample;
  _data_t local_58;
  undefined8 *local_40;
  Sample_t<kiste::terminal_t,_Data,_kiste::raw> local_38;
  
  local_38.child = (terminal_t *)0x200000001;
  local_38.data = (_data_t *)0x400000003;
  local_38._serialize = (_serializer_t *)0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_58.items,__l,(allocator_type *)&local_40);
  local_40 = &std::cout;
  local_38.child = (terminal_t *)&kiste::terminal;
  local_38.data = &local_58;
  local_38._serialize = (_serializer_t *)&local_40;
  test::Sample_t<kiste::terminal_t,_Data,_kiste::raw>::render(&local_38);
  if (local_58.items.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.items.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.items.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.items.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = kiste::raw{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
}